

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O3

sarima_object sarima_init(int p,int d,int q,int s,int P,int D,int Q,int N)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  sarima_object psVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  
  if (0 < N) {
    if (-1 < (s | P | p | q | D | d | Q)) {
      uVar1 = (uint)((D | d) == 0);
      iVar2 = q + p + P;
      iVar5 = iVar2 + Q;
      iVar7 = D * s + d;
      lVar6 = (long)((iVar5 + N) - iVar7);
      iVar3 = iVar5 + uVar1;
      psVar4 = (sarima_object)malloc(((long)iVar3 * (long)iVar3 + lVar6) * 8 + 0x98);
      psVar4->p = p;
      psVar4->d = d;
      psVar4->q = q;
      psVar4->N = N;
      psVar4->s = s;
      psVar4->P = P;
      psVar4->D = D;
      psVar4->Q = Q;
      psVar4->Nused = N - iVar7;
      psVar4->M = uVar1;
      psVar4->retval = 0;
      psVar4->cssml = 1;
      if (0 < iVar5) {
        memset(psVar4 + 1,0,(ulong)((Q + P + q + p) - 1) * 8 + 8);
      }
      psVar4->phi = (double *)(psVar4 + 1);
      psVar4->theta = (double *)(&psVar4[1].N + (ulong)(uint)p * 2);
      psVar4->PHI = (double *)(&psVar4[1].N + (long)(q + p) * 2);
      psVar4->THETA = (double *)(&psVar4[1].N + (long)iVar2 * 2);
      psVar4->res = (double *)(&psVar4[1].N + (long)iVar5 * 2);
      psVar4->vcov = (double *)(&psVar4[1].N + lVar6 * 2);
      psVar4->method = 0;
      psVar4->optmethod = 5;
      psVar4->mean = 0.0;
      psVar4->var = 1.0;
      psVar4->lvcov = iVar3 * iVar3;
      psVar4->ncoeff = iVar3;
      return psVar4;
    }
  }
  puts("\n Input Values cannot be Negative. Program Exiting. ");
  exit(-1);
}

Assistant:

sarima_object sarima_init(int p, int d, int q,int s, int P,int D,int Q, int N) {
	sarima_object obj = NULL;
	int i, M;

	if (d == 0 && D == 0) {
		M = 1;
	}
	else {
		M = 0;
	}

	if (p < 0 || d < 0 || q < 0 || N <= 0 || P < 0 || D < 0 || Q < 0 || s < 0) {
		printf("\n Input Values cannot be Negative. Program Exiting. \n");
		exit(-1);
	}

	//retval = 0 Input Error
	// retval = 1 Probable Success
	// retval = 4 Optimization Routine didn't converge
	// Retval = 15 Optimization Routine Encountered Inf/Nan Values

	obj = (sarima_object)malloc(sizeof(struct sarima_set) + sizeof(double)* (p + q + P + Q + N - d - s*D) + sizeof(double)* (p + q + P + Q + M)*(p + q + P + Q + M));

	obj->p = p;
	obj->d = d;
	obj->q = q;
	obj->N = N;
	obj->s = s;
	obj->P = P;
	obj->D = D;
	obj->Q = Q;
	obj->Nused = N - d - s*D;
	obj->M = M;
	obj->retval = 0;
	obj->cssml = 1;

	for (i = 0; i < p + q+P+Q; ++i) {
		obj->params[i] = 0.0;
	}
	obj->phi = &obj->params[0];
	obj->theta = &obj->params[p];
	obj->PHI = &obj->params[p + q];
	obj->THETA = &obj->params[p + q + P];
	obj->res = &obj->params[p + q+P+Q];
	obj->vcov = &obj->params[p + q + P + Q+ N - d - s*D];

	obj->method = 0;// 0 - MLE, 1 - CSS, 2 - Box-Jenkins
	obj->optmethod = 5; // Default Method is 5
	obj->mean = 0.0;
	obj->var = 1.0;
	obj->lvcov = (p + q + P + Q + M)*(p + q + P + Q + M);
	obj->ncoeff = p + q + P + Q + M;

	return obj;
}